

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O1

SimpleDFS * dg::vr::VRCodeGraph::dfs_end(void)

{
  _Rb_tree_header *p_Var1;
  SimpleDFS *in_RDI;
  
  p_Var1 = &(in_RDI->super_SimpleVisit).visited._M_t._M_impl.super__Rb_tree_header;
  (in_RDI->super_SimpleVisit).visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (in_RDI->super_SimpleVisit).visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  (in_RDI->super_SimpleVisit).visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (in_RDI->super_SimpleVisit).visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->stack).
  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->stack).
  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI->function = (Function *)0x0;
  (in_RDI->stack).
  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)&in_RDI->dir = 0;
  *(undefined8 *)&(in_RDI->super_SimpleVisit).visited._M_t._M_impl = 0;
  *(undefined8 *)&(in_RDI->super_SimpleVisit).visited._M_t._M_impl.super__Rb_tree_header._M_header =
       0;
  (in_RDI->super_SimpleVisit).visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (in_RDI->super_SimpleVisit).visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (in_RDI->super_SimpleVisit).visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->stack).
  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->stack).
  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(in_RDI->stack).
           super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(in_RDI->stack).
           super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  return in_RDI;
}

Assistant:

VRCodeGraph::SimpleDFS VRCodeGraph::dfs_end() { return SimpleDFS(); }